

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined4 extraout_var;
  reference arg_00;
  char *local_7e0;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720 [39];
  allocator<char> local_6f9;
  string local_6f8 [39];
  allocator<char> local_6d1;
  string local_6d0 [32];
  string local_6b0 [32];
  undefined1 local_690 [8];
  ostringstream cmCPackLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_4f0;
  undefined1 local_4d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  string local_4b0;
  char *local_490;
  char *default_dir_install_permissions;
  mode_t *default_dir_mode;
  mode_t default_dir_mode_v;
  allocator<char> local_451;
  undefined1 local_450 [8];
  string destDir;
  string local_428 [32];
  undefined1 local_408 [8];
  ostringstream cmCPackLog_msg_1;
  int res;
  char *tempInstallDirectory;
  string local_278;
  allocator<char> local_251;
  string local_250;
  byte local_229;
  string local_228 [7];
  bool setDestDir;
  string tempInstallDirectoryStr;
  string local_200;
  undefined1 local_1e0 [8];
  string bareTempInstallDirectory;
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar6 = std::operator<<((ostream *)local_190,"Install projects");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xaf,pcVar7);
  std::__cxx11::string::~string((string *)(bareTempInstallDirectory.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_190);
  CleanTemporaryDirectory(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"CPACK_TEMPORARY_INSTALL_DIRECTORY",
             (allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xf));
  pcVar7 = GetOption(this,&local_200);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1e0,pcVar7,
             (allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator
            ((allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tempInstallDirectoryStr.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string(local_228,(string *)local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"CPACK_SET_DESTDIR",&local_251);
  pcVar7 = GetOption(this,&local_250);
  bVar3 = cmSystemTools::IsOn(pcVar7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"CPACK_SET_DESTDIR",
             (allocator<char> *)((long)&tempInstallDirectory + 7));
  pcVar7 = GetOption(this,&local_278);
  bVar4 = cmSystemTools::IsInternallyOn(pcVar7);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tempInstallDirectory + 7));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  local_229 = bVar3 || bVar4;
  if (!bVar3 && !bVar4) {
    iVar5 = (*this->_vptr_cmCPackGenerator[0xb])();
    std::__cxx11::string::operator+=(local_228,(char *)CONCAT44(extraout_var,iVar5));
  }
  local_7e0 = (char *)std::__cxx11::string::c_str();
  bVar3 = cmsys::SystemTools::MakeDirectory((string *)local_1e0,(mode_t *)0x0);
  if (bVar3) {
    if ((local_229 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_dir_mode_v,"DESTDIR=",
                 (allocator<char> *)((long)&default_dir_mode + 7));
      cmsys::SystemTools::PutEnv((string *)&default_dir_mode_v);
      std::__cxx11::string::~string((string *)&default_dir_mode_v);
      std::allocator<char>::~allocator((allocator<char> *)((long)&default_dir_mode + 7));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_450,"DESTDIR=",&local_451);
      std::allocator<char>::~allocator(&local_451);
      std::__cxx11::string::operator+=((string *)local_450,local_7e0);
      cmsys::SystemTools::PutEnv((string *)local_450);
      std::__cxx11::string::~string((string *)local_450);
    }
    default_dir_mode._0_4_ = 0;
    default_dir_install_permissions = (char *)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
               (allocator<char> *)
               ((long)&items.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar7 = GetOption(this,&local_4b0);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&items.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_490 = pcVar7;
    if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4d0);
      pcVar7 = local_490;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,pcVar7,(allocator<char> *)((long)&__range2 + 7));
      cmSystemTools::ExpandListArgument
                (&local_4f0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4d0,false);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4d0);
      arg = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_4d0);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&arg), bVar3) {
        arg_00 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        bVar3 = cmFSPermissions::stringToModeT(arg_00,(mode_t *)&default_dir_mode);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_690);
          poVar6 = std::operator<<((ostream *)local_690,"Invalid permission value \'");
          poVar6 = std::operator<<(poVar6,(string *)arg_00);
          poVar6 = std::operator<<(poVar6,
                                   "\'. CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS value is invalid."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0xde,pcVar7);
          std::__cxx11::string::~string(local_6b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_690);
          this_local._4_4_ = 0;
          destDir.field_2._12_4_ = 1;
          goto LAB_0014dd58;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      default_dir_install_permissions = (char *)&default_dir_mode;
      destDir.field_2._12_4_ = 0;
LAB_0014dd58:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d0);
      if (destDir.field_2._12_4_ != 0) goto LAB_0014e1b1;
    }
    bVar2 = local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_6d0,local_7e0,&local_6d1);
    iVar5 = (*this->_vptr_cmCPackGenerator[0x10])(this,(ulong)(bVar2 & 1),local_6d0);
    std::__cxx11::string::~string(local_6d0);
    std::allocator<char>::~allocator(&local_6d1);
    bVar2 = local_229;
    if (iVar5 == 0) {
      this_local._4_4_ = 0;
      destDir.field_2._12_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_6f8,local_7e0,&local_6f9);
      iVar5 = (*this->_vptr_cmCPackGenerator[0x11])(this,(ulong)(bVar2 & 1),local_6f8);
      std::__cxx11::string::~string(local_6f8);
      std::allocator<char>::~allocator(&local_6f9);
      bVar2 = local_229;
      if (iVar5 == 0) {
        this_local._4_4_ = 0;
        destDir.field_2._12_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_720,local_7e0,&local_721);
        iVar5 = (*this->_vptr_cmCPackGenerator[0x12])
                          (this,(ulong)(bVar2 & 1),local_720,default_dir_install_permissions);
        std::__cxx11::string::~string(local_720);
        std::allocator<char>::~allocator(&local_721);
        if (iVar5 == 0) {
          this_local._4_4_ = 0;
          destDir.field_2._12_4_ = 1;
        }
        else {
          iVar5 = (*this->_vptr_cmCPackGenerator[0x13])
                            (this,(ulong)(local_229 & 1),local_1e0,default_dir_install_permissions);
          if (iVar5 == 0) {
            this_local._4_4_ = 0;
            destDir.field_2._12_4_ = 1;
          }
          else {
            if ((local_229 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_748,"DESTDIR=",&local_749);
              cmsys::SystemTools::PutEnv(&local_748);
              std::__cxx11::string::~string((string *)&local_748);
              std::allocator<char>::~allocator(&local_749);
            }
            this_local._4_4_ = 1;
            destDir.field_2._12_4_ = 1;
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    poVar6 = std::operator<<((ostream *)local_408,"Problem creating temporary directory: ");
    if (local_7e0 == (char *)0x0) {
      local_7e0 = "(NULL)";
    }
    poVar6 = std::operator<<(poVar6,local_7e0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xc1,pcVar7);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    this_local._4_4_ = 0;
    destDir.field_2._12_4_ = 1;
  }
LAB_0014e1b1:
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string((string *)local_1e0);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR")) |
    cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir) {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
  }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if (!cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem creating temporary directory: "
                    << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                    << std::endl);
    return 0;
  }

  if (setDestDir) {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
  } else {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
  }

  // prepare default created directory permissions
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = nullptr;
  const char* default_dir_install_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!cmFSPermissions::stringToModeT(arg, default_dir_mode_v)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Invalid permission value '"
                        << arg
                        << "'."
                           " CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
                           "value is invalid."
                        << std::endl);
        return 0;
      }
    }

    default_dir_mode = &default_dir_mode_v;
  }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if (!this->InstallProjectViaInstallCommands(setDestDir,
                                              tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if (!this->InstallProjectViaInstallScript(setDestDir,
                                            tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if (!this->InstallProjectViaInstalledDirectories(
        setDestDir, tempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if (!this->InstallProjectViaInstallCMakeProjects(
        setDestDir, bareTempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  if (setDestDir) {
    cmSystemTools::PutEnv("DESTDIR=");
  }

  return res;
}